

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

void __thiscall QPlainTextDocumentLayoutPrivate::relayout(QPlainTextDocumentLayoutPrivate *this)

{
  QRectF *pQVar1;
  char cVar2;
  long in_FS_OFFSET;
  undefined1 *local_58;
  undefined4 uStack_50;
  undefined1 *local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QRectF **)&this->field_0x8;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_30 = 0xaaaaaaaa;
  uStack_2c = 0xaaaaaaaa;
  QAbstractTextDocumentLayout::document();
  QTextDocument::firstBlock();
  while( true ) {
    cVar2 = QTextBlock::isValid();
    if (cVar2 == '\0') break;
    QTextBlock::layout();
    QTextLayout::clearLayout();
    QTextBlock::isVisible();
    QTextBlock::setLineCount((int)&local_38);
    QTextBlock::next();
    local_38 = local_58;
    uStack_30 = uStack_50;
  }
  QAbstractTextDocumentLayout::update(pQVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextDocumentLayoutPrivate::relayout()
{
    Q_Q(QPlainTextDocumentLayout);
    QTextBlock block = q->document()->firstBlock();
    while (block.isValid()) {
        block.layout()->clearLayout();
        block.setLineCount(block.isVisible() ? 1 : 0);
        block = block.next();
    }
    emit q->update();
}